

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_unicode.c
# Opt level: O0

PHYSFS_uint32 utf32codepoint(PHYSFS_uint32 **_str)

{
  uint local_24;
  PHYSFS_uint32 cp;
  PHYSFS_uint32 *src;
  PHYSFS_uint32 **_str_local;
  
  local_24 = **_str;
  if (local_24 == 0) {
    _str_local._4_4_ = 0;
  }
  else {
    if (0x10fff < local_24) {
      local_24 = 0x3f;
    }
    *_str = *_str + 1;
    _str_local._4_4_ = local_24;
  }
  return _str_local._4_4_;
}

Assistant:

static PHYSFS_uint32 utf32codepoint(const PHYSFS_uint32 **_str)
{
    const PHYSFS_uint32 *src = *_str;
    PHYSFS_uint32 cp = *(src++);

    if (cp == 0)  /* null terminator, end of string. */
        return 0;
    else if (cp > 0x10FFF)
        cp = UNICODE_BOGUS_CHAR_CODEPOINT;

    *_str = src;
    return cp;
}